

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O1

shared_ptr<MPL::ModelPackageItemInfo> __thiscall
MPL::detail::ModelPackageImpl::findItem(ModelPackageImpl *this,string *name,string *author)

{
  long lVar1;
  size_t sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_type sVar7;
  shared_ptr<MPL::ModelPackageItemInfo> sVar8;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  identifiers;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_50;
  _Alloc_hider local_38;
  
  local_38._M_p = (pointer)name;
  getItemInfoEntries((ModelPackageImpl *)local_60);
  if ((JsonMap *)local_60._0_8_ != (JsonMap *)0x0) {
    local_60._8_8_ = 0;
    aStack_50._M_allocated_capacity = 0;
    aStack_50._8_8_ = 0;
    JsonMap::getKeys((JsonMap *)local_60._0_8_,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_60 + 8));
    uVar5 = aStack_50._M_allocated_capacity;
    for (sVar7 = local_60._8_8_; sVar7 != uVar5; sVar7 = sVar7 + 0x20) {
      findItem(this,(string *)local_38._M_p);
      lVar1 = *(long *)(this->m_packagePath)._M_pathname._M_dataplus._M_p;
      sVar2 = *(size_t *)(lVar1 + 0x68);
      if (sVar2 == in_RCX[1]) {
        if (sVar2 != 0) {
          iVar6 = bcmp(*(void **)(lVar1 + 0x60),(void *)*in_RCX,sVar2);
          if (iVar6 != 0) goto LAB_00120a7d;
        }
        sVar2 = *(size_t *)(lVar1 + 0x48);
        if (sVar2 != author->_M_string_length) goto LAB_00120a7d;
        bVar3 = true;
        if (sVar2 != 0) {
          iVar6 = bcmp(*(void **)(lVar1 + 0x40),(author->_M_dataplus)._M_p,sVar2);
          if (iVar6 != 0) goto LAB_00120a7d;
        }
        bVar4 = false;
      }
      else {
LAB_00120a7d:
        bVar4 = true;
        bVar3 = false;
      }
      if ((!bVar3) &&
         (this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (this->m_packagePath)._M_pathname._M_string_length,
         this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (!bVar4) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_60 + 8));
        goto LAB_00120ab9;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_60 + 8));
  }
  (this->m_packagePath)._M_pathname._M_dataplus._M_p = (pointer)0x0;
  (this->m_packagePath)._M_pathname._M_string_length = 0;
LAB_00120ab9:
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_60);
  sVar8.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar8.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MPL::ModelPackageItemInfo>)
         sVar8.super___shared_ptr<MPL::ModelPackageItemInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ModelPackageItemInfo> ModelPackageImpl::findItem(const std::string& name, const std::string& author) const
{
    auto itemInfoEntries = getItemInfoEntries();
    if (itemInfoEntries != nullptr) {
        std::vector<std::string> identifiers;
        itemInfoEntries->getKeys(identifiers);
        for (const auto& identifier : identifiers) {
            auto itemInfo = findItem(identifier);
            if (itemInfo->author() == author && itemInfo->name() == name) {
                return itemInfo;
            }
        }
    }
    
    return nullptr;
}